

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void __thiscall
TcpServer::BindNewConnection
          (TcpServer *this,
          function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>
          *fnNewConnection)

{
  BaseSocketImpl *pBVar1;
  long *local_50;
  function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)> local_38;
  function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)> *local_18;
  function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>
  *fnNewConnection_local;
  TcpServer *this_local;
  
  local_18 = fnNewConnection;
  fnNewConnection_local =
       (function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)> *)this;
  pBVar1 = BaseSocket::GetImpl(&this->super_BaseSocket);
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    local_50 = (long *)0x0;
  }
  else {
    local_50 = (long *)__dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&TcpServerImpl::typeinfo,0);
  }
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>::function
            (&local_38,fnNewConnection);
  (**(code **)(*local_50 + 0x88))(local_50,&local_38);
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>::~function
            (&local_38);
  return;
}

Assistant:

void TcpServer::BindNewConnection(std::function<void(const std::vector<TcpSocket*>&)> fnNewConnection)
{
    dynamic_cast<TcpServerImpl*>(GetImpl())->BindNewConnection(fnNewConnection);
}